

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O3

CURLcode cf_hc_shutdown(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  void *pvVar2;
  long *plVar3;
  curl_trc_feat *pcVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  bool bVar9;
  CURLcode CVar10;
  cf_hc_baller *b;
  _Bool bdone;
  char local_39;
  Curl_cfilter *local_38;
  
  if ((cf->field_0x24 & 1) == 0) {
    pvVar2 = cf->ctx;
    lVar8 = (long)pvVar2 + 0x28;
    bVar5 = true;
    local_38 = cf;
    do {
      bVar9 = bVar5;
      local_39 = '\0';
      if (((((*(byte *)(lVar8 + 0x2c) & 1) != 0) &&
           (plVar3 = *(long **)(lVar8 + 8), plVar3 != (long *)0x0)) &&
          ((*(byte *)(lVar8 + 0x2c) & 2) == 0)) && (*(int *)(lVar8 + 0x10) == 0)) {
        iVar6 = (**(code **)(*plVar3 + 0x28))(plVar3,data,&local_39);
        *(int *)(lVar8 + 0x10) = iVar6;
        if ((iVar6 != 0) || (local_39 == '\x01')) {
          *(byte *)(lVar8 + 0x2c) = *(byte *)(lVar8 + 0x2c) | 2;
        }
      }
      lVar8 = (long)pvVar2 + 0x58;
      bVar5 = false;
    } while (bVar9);
    *done = true;
    lVar8 = 0x28;
    bVar5 = true;
    CVar10 = CURLE_OK;
    bVar9 = true;
    do {
      bVar7 = bVar9;
      if ((*(byte *)((long)pvVar2 + lVar8 + 0x2c) & 2) == 0) {
        *done = false;
        bVar5 = false;
      }
      lVar8 = 0x58;
      bVar9 = false;
    } while (bVar7);
    if (bVar5) {
      lVar8 = 0x28;
      CVar10 = CURLE_OK;
      bVar9 = true;
      do {
        bVar7 = bVar9;
        CVar1 = *(CURLcode *)((long)pvVar2 + lVar8 + 0x10);
        if (CVar1 != CURLE_OK) {
          CVar10 = CVar1;
        }
        lVar8 = 0x58;
        bVar9 = false;
      } while (bVar7);
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
      pcVar4 = (data->state).feat;
      if (pcVar4 == (curl_trc_feat *)0x0) {
        if (local_38 == (Curl_cfilter *)0x0) {
          return CVar10;
        }
      }
      else {
        if (local_38 == (Curl_cfilter *)0x0) {
          return CVar10;
        }
        if (pcVar4->log_level < 1) {
          return CVar10;
        }
      }
      if (0 < local_38->cft->log_level) {
        Curl_trc_cf_infof(data,local_38,"shutdown -> %d, done=%d",(ulong)CVar10,(ulong)bVar5);
      }
    }
  }
  else {
    *done = true;
    CVar10 = CURLE_OK;
  }
  return CVar10;
}

Assistant:

static CURLcode cf_hc_shutdown(struct Curl_cfilter *cf,
                               struct Curl_easy *data, bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct cf_hc_baller *ballers[2];
  size_t i;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* shutdown all ballers that have not done so already. If one fails,
   * continue shutting down others until all are shutdown. */
  ballers[0] = &ctx->h3_baller;
  ballers[1] = &ctx->h21_baller;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    struct cf_hc_baller *b = ballers[i];
    bool bdone = FALSE;
    if(!cf_hc_baller_is_active(b) || b->shutdown)
      continue;
    b->result = b->cf->cft->do_shutdown(b->cf, data, &bdone);
    if(b->result || bdone)
      b->shutdown = TRUE; /* treat a failed shutdown as done */
  }

  *done = TRUE;
  for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
    if(ballers[i] && !ballers[i]->shutdown)
      *done = FALSE;
  }
  if(*done) {
    for(i = 0; i < sizeof(ballers)/sizeof(ballers[0]); i++) {
      if(ballers[i] && ballers[i]->result)
        result = ballers[i]->result;
    }
  }
  CURL_TRC_CF(data, cf, "shutdown -> %d, done=%d", result, *done);
  return result;
}